

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::aux::split_string
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,aux *this,string_view last,char sep)

{
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view last_local;
  
  last_local._M_str = (char *)last._M_len;
  last_local._M_len = (size_t)this;
  __n = ::std::basic_string_view<char,_std::char_traits<char>_>::find
                  ((basic_string_view<char,_std::char_traits<char>_> *)&last_local,(char)last._M_str
                   ,0);
  if (__n == 0xffffffffffffffff) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = last_local._M_len;
    (__return_storage_ptr__->first)._M_str = last_local._M_str;
  }
  else {
    bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&last_local,0,__n);
    bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&last_local,__n + 1,
                       0xffffffffffffffff);
    (__return_storage_ptr__->first)._M_len = bVar1._M_len;
    (__return_storage_ptr__->first)._M_str = bVar1._M_str;
    (__return_storage_ptr__->second)._M_len = bVar2._M_len;
    (__return_storage_ptr__->second)._M_str = bVar2._M_str;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> split_string(string_view last, char const sep)
	{
		auto const pos = last.find(sep);
		if (pos == string_view::npos) return {last, {}};
		else return {last.substr(0, pos), last.substr(pos + 1)};
	}